

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O2

MatrixXd * __thiscall
CppMLNN::cross_entropy
          (MatrixXd *__return_storage_ptr__,CppMLNN *this,MatrixXd *probs,MatrixXd *labels)

{
  MatrixXd log_probs;
  double local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_c8;
  void *local_b0 [3];
  type local_98;
  undefined1 local_70 [16];
  variable_if_dynamic<long,__1> local_60;
  scalar_constant_op<double> sStack_58;
  double local_50;
  
  local_d0 = 1e-10;
  local_c8.m_lhs = probs;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>>::operator+
            (&local_98,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>> *)&local_c8,
             &local_d0);
  local_70._8_8_ = local_98.m_lhs.m_expression;
  local_60.m_value = local_98.m_rhs.m_rows.m_value;
  sStack_58.m_other = (double)local_98.m_rhs.m_cols.m_value;
  local_50 = local_98.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b0,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>_>
              *)local_70);
  local_d0 = (double)CONCAT44(local_d0._4_4_,0xffffffff);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  cwiseProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (&local_c8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b0,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)labels);
  local_98.m_rhs.m_rows.m_value = (long)local_c8.m_lhs;
  local_98.m_rhs.m_cols.m_value = (long)local_c8.m_rhs;
  Eigen::operator*((type *)local_70,(int *)&local_d0,(StorageBaseType *)&local_98);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::PartialReduxExpr<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::internal::member_sum<double>,0>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::member_sum<double>,_0>_>
              *)local_70);
  free(local_b0[0]);
  return __return_storage_ptr__;
}

Assistant:

MatrixXd CppMLNN::cross_entropy(const MatrixXd& probs, const MatrixXd& labels) {
	MatrixXd log_probs = (probs.array() + pow(10, -10)).log(); // plus 10^-10 to avoid log(0)
	return MatrixXd(-1 * log_probs.cwiseProduct(labels).colwise().sum());
}